

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MapFieldGenerator::GenerateMembers
          (MapFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  Descriptor *pDVar1;
  FieldDescriptor *descriptor;
  FieldDescriptor *descriptor_00;
  mapped_type *pmVar2;
  Options *pOVar3;
  FieldGeneratorBase *pFVar4;
  FieldGeneratorBase *pFVar5;
  allocator local_71;
  string local_70;
  key_type local_50;
  
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  std::__cxx11::string::string((string *)&local_70,"key",(allocator *)&local_50);
  descriptor = Descriptor::FindFieldByName(pDVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  std::__cxx11::string::string((string *)&local_70,"value",(allocator *)&local_50);
  descriptor_00 = Descriptor::FindFieldByName(pDVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  FieldGeneratorBase::type_name_abi_cxx11_(&local_70,&this->super_FieldGeneratorBase,descriptor);
  std::__cxx11::string::string((string *)&local_50,"key_type_name",&local_71);
  this_00 = &(this->super_FieldGeneratorBase).variables_;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_50);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  FieldGeneratorBase::type_name_abi_cxx11_(&local_70,&this->super_FieldGeneratorBase,descriptor_00);
  std::__cxx11::string::string((string *)&local_50,"value_type_name",&local_71);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_50);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  pFVar4 = CreateFieldGenerator(descriptor,1,pOVar3);
  pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  pFVar5 = CreateFieldGenerator(descriptor_00,2,pOVar3);
  io::Printer::Print(printer,this_00,
                     "private static readonly pbc::MapField<$key_type_name$, $value_type_name$>.Codec _map_$name$_codec\n    = new pbc::MapField<$key_type_name$, $value_type_name$>.Codec("
                    );
  (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar4,printer);
  io::Printer::Print<>(printer,", ");
  (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[4])(pFVar5,printer);
  io::Printer::Print(printer,this_00,
                     ", $tag$);\nprivate readonly pbc::MapField<$key_type_name$, $value_type_name$> $name$_ = new pbc::MapField<$key_type_name$, $value_type_name$>();\n"
                    );
  WritePropertyDocComment(printer,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  io::Printer::Print(printer,this_00,
                     "$access_level$ pbc::MapField<$key_type_name$, $value_type_name$> $property_name$ {\n  get { return $name$_; }\n}\n"
                    );
  (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar5);
  (*(pFVar4->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar4);
  return;
}

Assistant:

void MapFieldGenerator::GenerateMembers(io::Printer* printer) {
  const FieldDescriptor* key_descriptor =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_descriptor =
      descriptor_->message_type()->FindFieldByName("value");
  variables_["key_type_name"] = type_name(key_descriptor);
  variables_["value_type_name"] = type_name(value_descriptor);
  std::unique_ptr<FieldGeneratorBase> key_generator(
      CreateFieldGenerator(key_descriptor, 1, this->options()));
  std::unique_ptr<FieldGeneratorBase> value_generator(
      CreateFieldGenerator(value_descriptor, 2, this->options()));

  printer->Print(
    variables_,
    "private static readonly pbc::MapField<$key_type_name$, $value_type_name$>.Codec _map_$name$_codec\n"
    "    = new pbc::MapField<$key_type_name$, $value_type_name$>.Codec(");
  key_generator->GenerateCodecCode(printer);
  printer->Print(", ");
  value_generator->GenerateCodecCode(printer);
  printer->Print(
    variables_,
    ", $tag$);\n"
    "private readonly pbc::MapField<$key_type_name$, $value_type_name$> $name$_ = new pbc::MapField<$key_type_name$, $value_type_name$>();\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ pbc::MapField<$key_type_name$, $value_type_name$> $property_name$ {\n"
    "  get { return $name$_; }\n"
    "}\n");
}